

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_rsaes_oaep_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,uchar *label,size_t label_len,size_t *olen,uchar *input,uchar *output,
              size_t output_max_len)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info;
  ulong dlen;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  size_t __n;
  long lVar7;
  mbedtls_md_context_t md_ctx;
  uchar lhash [64];
  uchar buf [1024];
  
  if ((mode == 1) && (ctx->padding != 1)) {
    return -0x4080;
  }
  uVar1 = ctx->len;
  if (uVar1 - 0x401 < 0xfffffffffffffc0f) {
    return -0x4080;
  }
  md_info = mbedtls_md_info_from_type(ctx->hash_id);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    return -0x4080;
  }
  bVar2 = mbedtls_md_get_size(md_info);
  dlen = (ulong)bVar2;
  if (uVar1 < (uint)bVar2 * 2 + 2) {
    return -0x4080;
  }
  if (mode == 0) {
    iVar3 = mbedtls_rsa_public(ctx,input,buf);
  }
  else {
    iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,buf);
  }
  if (iVar3 == 0) {
    mbedtls_md_init(&md_ctx);
    iVar3 = mbedtls_md_setup(&md_ctx,md_info,0);
    if (iVar3 == 0) {
      iVar3 = mgf_mask(buf + 1,dlen,buf + dlen + 1,~dlen + uVar1,&md_ctx);
      if ((iVar3 == 0) &&
         (iVar3 = mgf_mask(buf + dlen + 1,~dlen + uVar1,buf + 1,dlen,&md_ctx), iVar3 == 0)) {
        mbedtls_md_free(&md_ctx);
        iVar3 = mbedtls_md(md_info,label,label_len,lhash);
        if (iVar3 == 0) {
          for (uVar5 = 0; dlen != uVar5; uVar5 = uVar5 + 1) {
            buf[0] = buf[0] | buf[uVar5 + dlen + 1] ^ lhash[uVar5];
          }
          lVar6 = 0;
          uVar4 = 0;
          for (lVar7 = 0; (uVar1 - (uint)bVar2 * 2) + -2 != lVar7; lVar7 = lVar7 + 1) {
            uVar4 = uVar4 | buf[uVar5 + lVar7 + dlen + 1];
            lVar6 = lVar6 + (ulong)((-uVar4 & 0xff | uVar4) >> 7 ^ 1);
          }
          lVar7 = lVar6 + dlen + -0x438;
          iVar3 = -0x4100;
          if (buf[uVar5 + lVar7 + 0x439] == '\x01' && buf[0] == 0) {
            __n = (((uVar1 - dlen) - lVar6) - uVar5) - 2;
            iVar3 = -0x4400;
            if (__n <= output_max_len) {
              *olen = __n;
              memcpy(output,buf + uVar5 + lVar7 + 0x43a,__n);
              iVar3 = 0;
            }
          }
        }
        goto LAB_00138b0b;
      }
    }
    mbedtls_md_free(&md_ctx);
  }
LAB_00138b0b:
  mbedtls_zeroize(buf,0x400);
  mbedtls_zeroize(lhash,0x40);
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsaes_oaep_decrypt( mbedtls_rsa_context *ctx,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng,
                            int mode,
                            const unsigned char *label, size_t label_len,
                            size_t *olen,
                            const unsigned char *input,
                            unsigned char *output,
                            size_t output_max_len )
{
    int ret;
    size_t ilen, i, pad_len;
    unsigned char *p, bad, pad_done;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    unsigned char lhash[MBEDTLS_MD_MAX_SIZE];
    unsigned int hlen;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    /*
     * Parameters sanity checks
     */
    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ilen = ctx->len;

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    // checking for integer underflow
    if( 2 * hlen + 2 > ilen )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /*
     * RSA operation
     */
    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        goto cleanup;

    /*
     * Unmask data and generate lHash
     */
    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
    {
        mbedtls_md_free( &md_ctx );
        goto cleanup;
    }

    /* seed: Apply seedMask to maskedSeed */
    if( ( ret = mgf_mask( buf + 1, hlen, buf + hlen + 1, ilen - hlen - 1,
                          &md_ctx ) ) != 0 ||
    /* DB: Apply dbMask to maskedDB */
        ( ret = mgf_mask( buf + hlen + 1, ilen - hlen - 1, buf + 1, hlen,
                          &md_ctx ) ) != 0 )
    {
        mbedtls_md_free( &md_ctx );
        goto cleanup;
    }

    mbedtls_md_free( &md_ctx );

    /* Generate lHash */
    if( ( ret = mbedtls_md( md_info, label, label_len, lhash ) ) != 0 )
        goto cleanup;

    /*
     * Check contents, in "constant-time"
     */
    p = buf;
    bad = 0;

    bad |= *p++; /* First byte must be 0 */

    p += hlen; /* Skip seed */

    /* Check lHash */
    for( i = 0; i < hlen; i++ )
        bad |= lhash[i] ^ *p++;

    /* Get zero-padding len, but always read till end of buffer
     * (minus one, for the 01 byte) */
    pad_len = 0;
    pad_done = 0;
    for( i = 0; i < ilen - 2 * hlen - 2; i++ )
    {
        pad_done |= p[i];
        pad_len += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
    }

    p += pad_len;
    bad |= *p++ ^ 0x01;

    /*
     * The only information "leaked" is whether the padding was correct or not
     * (eg, no data is copied if it was not correct). This meets the
     * recommendations in PKCS#1 v2.2: an opponent cannot distinguish between
     * the different error conditions.
     */
    if( bad != 0 )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto cleanup;
    }

    if( ilen - ( p - buf ) > output_max_len )
    {
        ret = MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE;
        goto cleanup;
    }

    *olen = ilen - (p - buf);
    memcpy( output, p, *olen );
    ret = 0;

cleanup:
    mbedtls_zeroize( buf, sizeof( buf ) );
    mbedtls_zeroize( lhash, sizeof( lhash ) );

    return( ret );
}